

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> * __thiscall
tcb::unicode::
to_utf_string<char16_t,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,char32_t>
          (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
           *__return_storage_ptr__,unicode *this,
          __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
          first,__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                last)

{
  code_point cVar1;
  code_point u;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  reserve(__return_storage_ptr__,(long)first._M_current - (long)this >> 2);
  if (this != (unicode *)first._M_current) {
    do {
      cVar1 = *(code_point *)this;
      u = L'\xffffffff';
      if ((cVar1 & 0x1ff800U) != 0xd800) {
        u = cVar1;
      }
      if (0x10ffff < (uint)cVar1) {
        u = L'\xffffffff';
      }
      detail::utf_traits<char16_t,2>::encode<std::back_insert_iterator<std::__cxx11::u16string>>
                (u,(back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                    )__return_storage_ptr__);
      this = this + 4;
    } while (this != (unicode *)first._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<OutCharT>
to_utf_string(InputIt first, Sentinel last)
{
    using string_type = std::basic_string<OutCharT>;

    string_type output;

    // Try to minimise the number of reallocations
    if /*constexpr*/ (std::is_same<typename std::iterator_traits<InputIt>::iterator_category,
                                   std::random_access_iterator_tag>::value) {
        output.reserve(static_cast<typename string_type::size_type>(std::distance(first, last)));
    }

    utf_convert<OutCharT>(first, last, std::back_inserter(output));

    return output;
}